

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFieldInfo.h
# Opt level: O0

DataFieldInfo * __thiscall ser::DataFieldInfo::operator=(DataFieldInfo *this,DataFieldInfo *other)

{
  DataFieldInfo *other_local;
  DataFieldInfo *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)other);
  std::__cxx11::string::operator=((string *)&this->type_,(string *)&other->type_);
  this->bytesPerElement_ = other->bytesPerElement_;
  this->rank_ = other->rank_;
  this->iSize_ = other->iSize_;
  this->jSize_ = other->jSize_;
  this->kSize_ = other->kSize_;
  this->lSize_ = other->lSize_;
  this->iPlusHalo_ = other->iPlusHalo_;
  this->jPlusHalo_ = other->jPlusHalo_;
  this->kPlusHalo_ = other->kPlusHalo_;
  this->lPlusHalo_ = other->lPlusHalo_;
  this->iMinusHalo_ = other->iMinusHalo_;
  this->jMinusHalo_ = other->jMinusHalo_;
  this->kMinusHalo_ = other->kMinusHalo_;
  this->lMinusHalo_ = other->lMinusHalo_;
  MetainfoSet::operator=(&this->metainfo_,&other->metainfo_);
  return this;
}

Assistant:

DataFieldInfo& operator=(const DataFieldInfo& other)
        {
            name_ = other.name_;
            type_ = other.type_;
            bytesPerElement_ = other.bytesPerElement_;
            rank_ = other.rank_;
            iSize_ = other.iSize_;
            jSize_ = other.jSize_;
            kSize_ = other.kSize_;
            lSize_ = other.lSize_;
            iPlusHalo_ = other.iPlusHalo_;
            jPlusHalo_ = other.jPlusHalo_;
            kPlusHalo_ = other.kPlusHalo_;
            lPlusHalo_ = other.lPlusHalo_;
            iMinusHalo_ = other.iMinusHalo_;
            jMinusHalo_ = other.jMinusHalo_;
            kMinusHalo_ = other.kMinusHalo_;
            lMinusHalo_ = other.lMinusHalo_;
            metainfo_ = other.metainfo_;

            return *this;
        }